

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
Address_ElementsSegwitAddressFromHashTest_Test::~Address_ElementsSegwitAddressFromHashTest_Test
          (Address_ElementsSegwitAddressFromHashTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, ElementsSegwitAddressFromHashTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  const Script &script = builder.Build();
  ByteData256 script_hash = HashUtil::Sha256(script);
  AddressFormatData net_param = AddressFormatData::ConvertFromJson(
      "{\"nettype\":\"custom\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"}");

  Address address;
  EXPECT_NO_THROW((address = Address(NetType::kCustomChain,
                   WitnessVersion::kVersion0,
                   ByteData(pubkey_hash.GetBytes()), net_param)));
  EXPECT_STREQ("ert1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5udafvh6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kCustomChain, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());
  EXPECT_STREQ("0014925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetLockingScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kCustomChain,
                   WitnessVersion::kVersion0,
                   ByteData(script_hash.GetBytes()), net_param)));
  EXPECT_STREQ("ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kCustomChain, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_STREQ("0020c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201",
               address.GetLockingScript().GetHex().c_str());
}